

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

int Gia_ManMuxProfile(Mux_Man_t *p,int fWidth)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int i;
  uint uVar4;
  int *__s;
  long lVar5;
  char *pcVar6;
  int Counter;
  int iVar7;
  int iVar8;
  int i_1;
  ulong uVar9;
  
  __s = (int *)malloc(4000);
  if (__s != (int *)0x0) {
    memset(__s,0,4000);
  }
  uVar4 = p->vTops->nSize;
  if (fWidth == 0) {
    if (1 < (int)uVar4) {
      iVar7 = 1;
      do {
        pcVar6 = Abc_NamStr(p->pNames,iVar7);
        uVar4 = atoi(pcVar6);
        if ((int)uVar4 < 0) goto LAB_0021fbdb;
        uVar9 = (ulong)uVar4;
        if (0x3e6 < (int)uVar4) {
          uVar9 = 999;
        }
        __s[uVar9] = __s[uVar9] + 1;
        iVar7 = iVar7 + 1;
      } while (iVar7 < p->vTops->nSize);
    }
  }
  else if (1 < (int)uVar4) {
    pVVar2 = p->vTops->pArray;
    lVar5 = 0;
    do {
      uVar1 = *(uint *)((long)&pVVar2[1].nSize + lVar5);
      if ((int)uVar1 < 0) {
LAB_0021fbdb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      if (0x3e6 < (int)uVar1) {
        uVar1 = 999;
      }
      __s[uVar1] = __s[uVar1] + 1;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)uVar4 * 0x10 + -0x10 != lVar5);
  }
  lVar5 = 0;
  iVar7 = 0;
  do {
    iVar7 = iVar7 + (uint)(0 < __s[lVar5]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 1000);
  if (iVar7 == 0) {
    iVar7 = 0;
  }
  else {
    pcVar6 = "widths";
    if (fWidth == 0) {
      pcVar6 = "sizes";
    }
    printf("The distribution of MUX tree %s:\n",pcVar6);
    uVar9 = 0;
    iVar8 = 0;
    do {
      uVar4 = __s[uVar9];
      if (uVar4 != 0) {
        iVar8 = iVar8 + 1;
        if (iVar8 == 0xc) {
          putchar(10);
          iVar8 = 0;
        }
        printf("  %d=%d",uVar9 & 0xffffffff,(ulong)uVar4);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 1000);
    printf("\nSummary: ");
    iVar8 = *__s;
    lVar5 = 1;
    do {
      iVar3 = __s[lVar5];
      if (__s[lVar5] < iVar8) {
        iVar3 = iVar8;
      }
      iVar8 = iVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 1000);
    lVar5 = 0;
    printf("Max = %d  ");
    iVar8 = 0;
    do {
      iVar8 = iVar8 + __s[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 1000);
    printf("Ave = %.2f",(double)iVar8 / (double)iVar7);
    putchar(10);
    iVar7 = 1;
    if (__s != (int *)0x0) {
      free(__s);
    }
  }
  return iVar7;
}

Assistant:

int Gia_ManMuxProfile( Mux_Man_t * p, int fWidth )
{
    int i, Entry, Counter, Total;
    Vec_Int_t * vVec, * vCounts;
    vCounts = Vec_IntStart( 1000 );
    if ( fWidth )
    {
        Vec_WecForEachLevelStart( p->vTops, vVec, i, 1 )
            Vec_IntAddToEntry( vCounts, Abc_MinInt(Vec_IntSize(vVec), 999), 1 );
    }
    else
    {
        for ( i = 1; i < Vec_WecSize(p->vTops); i++ )
            Vec_IntAddToEntry( vCounts, Abc_MinInt(atoi(Abc_NamStr(p->pNames, i)), 999), 1 );
    }
    Total = Vec_IntCountPositive(vCounts);
    if ( Total == 0 )
        return 0;
    printf( "The distribution of MUX tree %s:\n", fWidth ? "widths" : "sizes"  );
    Counter = 0;
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        if ( !Entry ) continue;
        if ( ++Counter == 12 )
            printf( "\n" ), Counter = 0;
        printf( "  %d=%d", i, Entry );
    }
    printf( "\nSummary: " );
    printf( "Max = %d  ", Vec_IntFindMax(vCounts) );
    printf( "Ave = %.2f", 1.0*Vec_IntSum(vCounts)/Total );
    printf( "\n" );
    Vec_IntFree( vCounts );
    return 1;
}